

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void samplePushPrevious(Stat4Accum *p,int iChng)

{
  int iVar1;
  Stat4Sample *pNew;
  int local_28;
  int local_24;
  int j_1;
  int j;
  Stat4Sample *pBest;
  int i;
  int iChng_local;
  Stat4Accum *p_local;
  
  for (pBest._0_4_ = p->nCol + -2; iChng <= (int)pBest; pBest._0_4_ = (int)pBest + -1) {
    pNew = p->aBest + (int)pBest;
    pNew->anEq[(int)pBest] = (p->current).anEq[(int)pBest];
    if ((p->nSample < p->mxSample) || (iVar1 = sampleIsBetter(p,pNew,p->a + p->iMin), iVar1 != 0)) {
      sampleInsert(p,pNew,(int)pBest);
    }
  }
  pBest._0_4_ = p->nSample;
  while (pBest._0_4_ = (int)pBest + -1, -1 < (int)pBest) {
    for (local_24 = p->nMaxEqZero; local_24 < p->nCol; local_24 = local_24 + 1) {
    }
  }
  if (iChng < p->nMaxEqZero) {
    pBest._0_4_ = p->nSample;
    while (pBest._0_4_ = (int)pBest + -1, local_28 = iChng, -1 < (int)pBest) {
      for (; local_28 < p->nCol; local_28 = local_28 + 1) {
        if (p->a[(int)pBest].anEq[local_28] == 0) {
          p->a[(int)pBest].anEq[local_28] = (p->current).anEq[local_28];
        }
      }
    }
    p->nMaxEqZero = iChng;
  }
  return;
}

Assistant:

static void samplePushPrevious(Stat4Accum *p, int iChng){
#ifdef SQLITE_ENABLE_STAT4
  int i;

  /* Check if any samples from the aBest[] array should be pushed
  ** into IndexSample.a[] at this point.  */
  for(i=(p->nCol-2); i>=iChng; i--){
    Stat4Sample *pBest = &p->aBest[i];
    pBest->anEq[i] = p->current.anEq[i];
    if( p->nSample<p->mxSample || sampleIsBetter(p, pBest, &p->a[p->iMin]) ){
      sampleInsert(p, pBest, i);
    }
  }

  /* Check that no sample contains an anEq[] entry with an index of
  ** p->nMaxEqZero or greater set to zero. */
  for(i=p->nSample-1; i>=0; i--){
    int j;
    for(j=p->nMaxEqZero; j<p->nCol; j++) assert( p->a[i].anEq[j]>0 );
  }

  /* Update the anEq[] fields of any samples already collected. */
  if( iChng<p->nMaxEqZero ){
    for(i=p->nSample-1; i>=0; i--){
      int j;
      for(j=iChng; j<p->nCol; j++){
        if( p->a[i].anEq[j]==0 ) p->a[i].anEq[j] = p->current.anEq[j];
      }
    }
    p->nMaxEqZero = iChng;
  }
#endif

#if defined(SQLITE_ENABLE_STAT3) && !defined(SQLITE_ENABLE_STAT4)
  if( iChng==0 ){
    tRowcnt nLt = p->current.anLt[0];
    tRowcnt nEq = p->current.anEq[0];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+nEq)/p->nPSample ){
      p->current.isPSample = 1;
      sampleInsert(p, &p->current, 0);
      p->current.isPSample = 0;
    }else 

    /* Or if it is a non-periodic sample. Add it in this case too. */
    if( p->nSample<p->mxSample 
     || sampleIsBetter(p, &p->current, &p->a[p->iMin]) 
    ){
      sampleInsert(p, &p->current, 0);
    }
  }
#endif

#ifndef SQLITE_ENABLE_STAT3_OR_STAT4
  UNUSED_PARAMETER( p );
  UNUSED_PARAMETER( iChng );
#endif
}